

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Browser.cxx
# Opt level: O0

void __thiscall Fl_Browser::clear(Fl_Browser *this)

{
  FL_BLINE *pFVar1;
  FL_BLINE *n;
  FL_BLINE *l;
  Fl_Browser *this_local;
  
  n = this->first;
  while (n != (FL_BLINE *)0x0) {
    pFVar1 = n->next;
    free(n);
    n = pFVar1;
  }
  this->full_height_ = 0;
  this->first = (FL_BLINE *)0x0;
  this->last = (FL_BLINE *)0x0;
  this->lines = 0;
  Fl_Browser_::new_list(&this->super_Fl_Browser_);
  return;
}

Assistant:

void Fl_Browser::clear() {
  for (FL_BLINE* l = first; l;) {
    FL_BLINE* n = l->next;
    free(l);
    l = n;
  }
  full_height_ = 0;
  first = 0;
  last = 0;
  lines = 0;
  new_list();
}